

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O0

QModelIndex * __thiscall
QTransposeProxyModel::mapFromSource(QTransposeProxyModel *this,QModelIndex *sourceIndex)

{
  bool bVar1;
  parameter_type pQVar2;
  QModelIndex *in_RDI;
  QModelIndex *in_stack_00000008;
  QTransposeProxyModelPrivate *d;
  
  d_func((QTransposeProxyModel *)0x8b38a5);
  pQVar2 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                     ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                       *)0x8b38bb);
  if ((pQVar2 != (parameter_type)0x0) && (bVar1 = QModelIndex::isValid(in_RDI), bVar1)) {
    QTransposeProxyModelPrivate::uncheckedMapFromSource(d,in_stack_00000008);
    return in_RDI;
  }
  QModelIndex::QModelIndex((QModelIndex *)0x8b38d8);
  return in_RDI;
}

Assistant:

QModelIndex QTransposeProxyModel::mapFromSource(const QModelIndex &sourceIndex) const
{
    Q_D(const QTransposeProxyModel);
    if (!d->model || !sourceIndex.isValid())
        return QModelIndex();
    Q_ASSERT(d->model->checkIndex(sourceIndex));
    return d->uncheckedMapFromSource(sourceIndex);
}